

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_client_transporter.cpp
# Opt level: O1

void __thiscall
SocketClientTransporter::OnConnection(SocketClientTransporter *this,uv_connect_t *req,int status)

{
  _func_int **pp_Var1;
  
  this->connectionStatus = status;
  pp_Var1 = (this->super_Transporter)._vptr_Transporter;
  if (status < 0) {
    (*pp_Var1[2])();
    (*(this->super_Transporter)._vptr_Transporter[5])(this,0);
  }
  else {
    (*pp_Var1[5])(this,1);
    uv_read_start((uv_stream_t *)&this->uvClient,echo_alloc,after_read);
  }
  std::condition_variable::notify_all();
  return;
}

Assistant:

void SocketClientTransporter::OnConnection(uv_connect_t* req, int status) {
	this->connectionStatus = status;
	if (status >= 0) {
		OnConnect(true);
		uv_read_start((uv_stream_t*)&uvClient, echo_alloc, after_read);
	}
	else {
		Stop();
		OnConnect(false);
	}
	cv.notify_all();
}